

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  domain_error *pdVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar9;
  ostringstream oss;
  allocator local_2d2;
  allocator local_2d1;
  string local_2d0;
  TagAliasRegistry *local_2b0;
  string local_2a8;
  pair<const_char_*,_Catch::TagAlias> local_288;
  SourceLineInfo local_238;
  string local_210;
  TagAlias local_1f0;
  value_type local_1a8 [3];
  
  local_2b0 = this;
  std::__cxx11::string::string((string *)local_1a8,alias,&local_2d1);
  psVar1 = &local_288.second.tag._M_string_length;
  local_288.first = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"[@","");
  bVar5 = startsWith(&local_1a8[0].first,(string *)&local_288);
  bVar6 = true;
  if (bVar5) {
    std::__cxx11::string::string((string *)&local_2d0,alias,&local_2d2);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"]","");
    bVar6 = endsWith(&local_2d0,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    bVar6 = !bVar6;
  }
  if ((size_type *)local_288.first != psVar1) {
    operator_delete(local_288.first);
  }
  paVar2 = &local_1a8[0].first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].first._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0].first._M_dataplus._M_p);
  }
  if (!bVar6) {
    std::__cxx11::string::string((string *)&local_210,tag,(allocator *)&local_2a8);
    paVar3 = &local_238.file.field_2;
    pcVar4 = (lineInfo->file)._M_dataplus._M_p;
    local_238.file._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,pcVar4 + (lineInfo->file)._M_string_length);
    local_238.line = lineInfo->line;
    TagAlias::TagAlias(&local_1f0,&local_210,&local_238);
    local_2d0._M_dataplus._M_p = alias;
    std::pair<const_char_*,_Catch::TagAlias>::pair(&local_288,(char **)&local_2d0,&local_1f0);
    std::pair<std::__cxx11::string_const,Catch::TagAlias>::pair<char_const*,Catch::TagAlias>
              ((pair<std::__cxx11::string_const,Catch::TagAlias> *)local_1a8,&local_288);
    pVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
            ::_M_insert_unique(&(local_2b0->m_registry)._M_t,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].second.lineInfo.file._M_dataplus._M_p !=
        &local_1a8[0].second.lineInfo.file.field_2) {
      operator_delete(local_1a8[0].second.lineInfo.file._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].second.tag._M_dataplus._M_p != &local_1a8[0].second.tag.field_2) {
      operator_delete(local_1a8[0].second.tag._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].first._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8[0].first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.second.lineInfo.file._M_dataplus._M_p !=
        &local_288.second.lineInfo.file.field_2) {
      operator_delete(local_288.second.lineInfo.file._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.second.tag._M_dataplus._M_p != &local_288.second.tag.field_2) {
      operator_delete(local_288.second.tag._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.lineInfo.file._M_dataplus._M_p != &local_1f0.lineInfo.file.field_2) {
      operator_delete(local_1f0.lineInfo.file._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.tag._M_dataplus._M_p != &local_1f0.tag.field_2) {
      operator_delete(local_1f0.tag._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.file._M_dataplus._M_p != paVar3) {
      operator_delete(local_238.file._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"error: tag alias, \"",0x13);
    poVar7 = std::operator<<((ostream *)local_1a8,alias);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" already registered.\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tFirst seen at ",0xf);
    std::__cxx11::string::string((string *)&local_2d0,alias,(allocator *)&local_2a8);
    (*(local_2b0->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])
              (&local_288,local_2b0,&local_2d0);
    operator<<(poVar7,(SourceLineInfo *)((long)local_288.first + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tRedefined at ",0xe);
    operator<<(poVar7,lineInfo);
    Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string
              ((string *)&local_288,local_2d0._M_dataplus._M_p,(allocator *)&local_2a8);
    std::domain_error::domain_error(pdVar8,(string *)&local_288);
    __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"error: tag alias, \"",0x13);
  poVar7 = std::operator<<((ostream *)local_1a8,alias);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"\" is not of the form [@alias name].\n",0x24);
  operator<<(poVar7,lineInfo);
  pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&local_288,local_2d0._M_dataplus._M_p,(allocator *)&local_2a8);
  std::domain_error::domain_error(pdVar8,(string *)&local_288);
  __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }